

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QStringList * __thiscall
MakefileGenerator::escapeFilePaths(MakefileGenerator *this,QStringList *paths)

{
  QList<QString> *this_00;
  qsizetype qVar1;
  const_reference pQVar2;
  QList<QString> *in_RDX;
  long *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int i;
  QStringList *ret;
  rvalue_ref in_stack_ffffffffffffff98;
  int local_40;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x19f6f6);
  local_40 = 0;
  while( true ) {
    this_00 = (QList<QString> *)(long)local_40;
    qVar1 = QList<QString>::size(in_RDX);
    if (qVar1 <= (long)this_00) break;
    pQVar2 = QList<QString>::at(this_00,(qsizetype)in_stack_ffffffffffffff98);
    (**(code **)(*in_RSI + 0x60))(local_20,in_RSI,pQVar2);
    QList<QString>::append(this_00,in_stack_ffffffffffffff98);
    QString::~QString((QString *)0x19f75a);
    local_40 = local_40 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList
MakefileGenerator::escapeFilePaths(const QStringList &paths) const
{
    QStringList ret;
    for(int i = 0; i < paths.size(); ++i)
        ret.append(escapeFilePath(paths.at(i)));
    return ret;
}